

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  MSize in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (long)(in_ESI + 1) * 8;
  }
  else if (*(ulong *)(in_RDI + 0x18) < (ulong)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8)) {
    if ((ulong)*(uint *)(in_RDI + 0x20) <= (ulong)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8)) {
      lj_state_growstack((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffec);
    }
    do {
      lVar1 = *(long *)(in_RDI + 0x18);
      *(long *)(in_RDI + 0x18) = lVar1 + 8;
      *(undefined4 *)(lVar1 + 4) = 0xffffffff;
    } while (*(ulong *)(in_RDI + 0x18) < (ulong)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8));
  }
  else {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  }
  return;
}

Assistant:

LUA_API void lua_settop(lua_State *L, int idx)
{
  if (idx >= 0) {
    lj_checkapi(idx <= tvref(L->maxstack) - L->base, "bad stack slot %d", idx);
    if (L->base + idx > L->top) {
      if (L->base + idx >= tvref(L->maxstack))
	lj_state_growstack(L, (MSize)idx - (MSize)(L->top - L->base));
      do { setnilV(L->top++); } while (L->top < L->base + idx);
    } else {
      L->top = L->base + idx;
    }
  } else {
    lj_checkapi(-(idx+1) <= (L->top - L->base), "bad stack slot %d", idx);
    L->top += idx+1;  /* Shrinks top (idx < 0). */
  }
}